

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::convert_quads_to_grids(Ref<embree::SceneGraph::Node> *node,uint resX,uint resY)

{
  long *plVar1;
  Node *pNVar2;
  bool bVar3;
  long *plVar4;
  size_type sVar5;
  reference pvVar6;
  undefined4 in_ECX;
  undefined4 in_EDX;
  long *in_RSI;
  Node *in_RDI;
  Ref<embree::SceneGraph::QuadMeshNode> qmesh;
  size_t i;
  Ref<embree::SceneGraph::GroupNode> groupNode;
  Ref<embree::SceneGraph::MultiTransformNode> xfmNode_1;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  long *local_3f0;
  long *local_380;
  long *local_320;
  long *local_2c0;
  Node *local_278;
  ulong local_270;
  long local_258;
  long local_240;
  uint in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe44;
  Ref<embree::SceneGraph::QuadMeshNode> *in_stack_fffffffffffffe48;
  
  if (*in_RSI == 0) {
    local_2c0 = (long *)0x0;
  }
  else {
    local_2c0 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  if (local_2c0 != (long *)0x0) {
    (**(code **)(*local_2c0 + 0x10))();
  }
  if (local_2c0 == (long *)0x0) {
    if (*in_RSI == 0) {
      local_320 = (long *)0x0;
    }
    else {
      local_320 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
    }
    if (local_320 == (long *)0x0) {
      if (*in_RSI == 0) {
        local_380 = (long *)0x0;
      }
      else {
        local_380 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      if (local_380 == (long *)0x0) {
        if (*in_RSI == 0) {
          local_3f0 = (long *)0x0;
        }
        else {
          local_3f0 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
        }
        if (local_3f0 == (long *)0x0) {
          bVar3 = false;
        }
        else {
          (**(code **)(*local_3f0 + 0x10))();
          if (local_3f0 != (long *)0x0) {
            (**(code **)(*local_3f0 + 0x10))();
          }
          convert_quads_to_grids
                    (in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
          if (local_3f0 != (long *)0x0) {
            (**(code **)(*local_3f0 + 0x18))();
          }
          bVar3 = true;
        }
        if (local_3f0 != (long *)0x0) {
          (**(code **)(*local_3f0 + 0x18))();
        }
        if (!bVar3) goto LAB_001db757;
      }
      else {
        (**(code **)(*local_380 + 0x10))();
        for (local_270 = 0;
            sVar5 = std::
                    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                    ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                            *)(local_380 + 0xd)), local_270 < sVar5; local_270 = local_270 + 1) {
          pvVar6 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_380 + 0xd),local_270);
          pNVar2 = pvVar6->ptr;
          if (pNVar2 != (Node *)0x0) {
            (*(pNVar2->super_RefCount)._vptr_RefCount[2])();
          }
          convert_quads_to_grids
                    ((Ref<embree::SceneGraph::Node> *)CONCAT44(in_EDX,in_ECX),
                     (uint)((ulong)local_2c0 >> 0x20),(uint)local_2c0);
          pvVar6 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_380 + 0xd),local_270);
          if (pvVar6->ptr != (Node *)0x0) {
            (*(pvVar6->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          pvVar6->ptr = local_278;
          local_278 = (Node *)0x0;
          if (pNVar2 != (Node *)0x0) {
            (*(pNVar2->super_RefCount)._vptr_RefCount[3])();
          }
        }
LAB_001db757:
        bVar3 = false;
      }
      if (local_380 != (long *)0x0) {
        (**(code **)(*local_380 + 0x18))();
      }
      if (!bVar3) goto LAB_001db7f3;
    }
    else {
      (**(code **)(*local_320 + 0x10))();
      plVar1 = (long *)local_320[0x10];
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x10))();
      }
      convert_quads_to_grids
                ((Ref<embree::SceneGraph::Node> *)CONCAT44(in_EDX,in_ECX),
                 (uint)((ulong)local_2c0 >> 0x20),(uint)local_2c0);
      plVar4 = local_320 + 0x10;
      if (*plVar4 != 0) {
        (**(code **)(*(long *)*plVar4 + 0x18))();
      }
      *plVar4 = local_258;
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x18))();
      }
LAB_001db7f3:
      bVar3 = false;
    }
    if (local_320 != (long *)0x0) {
      (**(code **)(*local_320 + 0x18))();
    }
    if (bVar3) goto LAB_001db89d;
  }
  else {
    plVar1 = (long *)local_2c0[0x13];
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x10))();
    }
    convert_quads_to_grids
              ((Ref<embree::SceneGraph::Node> *)CONCAT44(in_EDX,in_ECX),
               (uint)((ulong)local_2c0 >> 0x20),(uint)local_2c0);
    plVar4 = local_2c0 + 0x13;
    if (*plVar4 != 0) {
      (**(code **)(*(long *)*plVar4 + 0x18))();
    }
    *plVar4 = local_240;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x18))();
    }
  }
  bVar3 = false;
LAB_001db89d:
  if (local_2c0 != (long *)0x0) {
    (**(code **)(*local_2c0 + 0x18))();
  }
  if (!bVar3) {
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)*in_RSI;
    *in_RSI = 0;
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_quads_to_grids(Ref<SceneGraph::Node> node, const unsigned int resX, const unsigned int resY )
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = convert_quads_to_grids(xfmNode->child, resX, resY);
    } 
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = convert_quads_to_grids(xfmNode->child, resX, resY);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = convert_quads_to_grids(groupNode->children[i], resX, resY);
    }
    else if (Ref<SceneGraph::QuadMeshNode> qmesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) {
      return convert_quads_to_grids(qmesh, resX, resY);
    }
    return node;
  }